

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  BaseNode *node;
  ulong uVar14;
  long lVar15;
  undefined4 uVar16;
  ulong uVar17;
  byte bVar18;
  undefined4 uVar19;
  uint uVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar35;
  vint4 ai_1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar49;
  float fVar50;
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar51;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar91;
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar90;
  float fVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  float fVar112;
  undefined1 auVar113 [16];
  float fVar120;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  float fVar140;
  undefined1 auVar141 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar142 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  float fVar155;
  undefined1 auVar149 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar156;
  undefined1 auVar150 [64];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 in_ZMM15 [64];
  undefined1 auVar158 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_a8d;
  int local_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  undefined8 local_a68;
  float fStack_a60;
  float fStack_a5c;
  Scene *local_a50;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  long local_9e8;
  long local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  RTCFilterFunctionNArguments local_9a8;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar4 = ray->tfar;
    if (0.0 <= fVar4) {
      puVar22 = local_7d0;
      aVar5 = (ray->dir).field_0;
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar5,auVar27);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar94,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar5,auVar94,auVar27);
      auVar94 = vrcpps_avx(auVar27);
      fVar77 = auVar94._0_4_;
      auVar64._0_4_ = fVar77 * auVar27._0_4_;
      fVar86 = auVar94._4_4_;
      auVar64._4_4_ = fVar86 * auVar27._4_4_;
      fVar89 = auVar94._8_4_;
      auVar64._8_4_ = fVar89 * auVar27._8_4_;
      fVar62 = auVar94._12_4_;
      auVar64._12_4_ = fVar62 * auVar27._12_4_;
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar95,auVar64);
      auVar65._0_4_ = fVar77 + fVar77 * auVar27._0_4_;
      auVar65._4_4_ = fVar86 + fVar86 * auVar27._4_4_;
      auVar65._8_4_ = fVar89 + fVar89 * auVar27._8_4_;
      auVar65._12_4_ = fVar62 + fVar62 * auVar27._12_4_;
      uVar16 = *(undefined4 *)&(ray->org).field_0;
      auVar111 = ZEXT1664(CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))));
      uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar117 = ZEXT1664(CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))));
      uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar124 = ZEXT1664(CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))));
      auVar27 = vshufps_avx(auVar65,auVar65,0);
      auVar126 = ZEXT1664(auVar27);
      auVar27 = vmovshdup_avx(auVar65);
      auVar94 = vshufps_avx(auVar65,auVar65,0x55);
      auVar131 = ZEXT1664(auVar94);
      auVar94 = vshufpd_avx(auVar65,auVar65,1);
      auVar64 = vshufps_avx(auVar65,auVar65,0xaa);
      auVar136 = ZEXT1664(auVar64);
      uVar23 = (ulong)(auVar65._0_4_ < 0.0) << 2;
      uVar1 = (ulong)(auVar27._0_4_ < 0.0) * 4 + 8;
      uVar2 = (ulong)(auVar94._0_4_ < 0.0) * 4 + 0x10;
      uVar24 = uVar23 ^ 4;
      auVar27 = vshufps_avx(auVar42,auVar42,0);
      auVar142 = ZEXT1664(auVar27);
      auVar27 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar150 = ZEXT1664(auVar27);
      local_978 = mm_lookupmask_ps._240_16_;
      auVar27 = vpcmpeqd_avx(in_ZMM15._0_16_,in_ZMM15._0_16_);
      auVar158 = ZEXT1664(auVar27);
      do {
        uVar25 = puVar22[-1];
        puVar22 = puVar22 + -1;
        while( true ) {
          local_8f8 = auVar111._0_16_;
          local_908 = auVar117._0_16_;
          local_918 = auVar124._0_16_;
          if ((uVar25 & 8) != 0) break;
          uVar14 = uVar25 & 0xfffffffffffffff0;
          puVar21 = (ulong *)(uVar14 + 0x20);
          if (uVar14 == 0) {
            puVar21 = (ulong *)0x0;
          }
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *puVar21;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)puVar21 + 4);
          auVar27 = vpminub_avx(auVar26,auVar38);
          auVar27 = vpcmpeqb_avx(auVar26,auVar27);
          auVar27 = vpmovzxbd_avx(auVar158._0_16_ ^ auVar27);
          auVar27 = vpslld_avx(auVar158._0_16_ ^ auVar27,0x1f);
          uVar16 = vmovmskps_avx(auVar27);
          fVar4 = *(float *)(puVar21 + 3);
          fVar77 = *(float *)((long)puVar21 + 0x24);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)((long)puVar21 + uVar23);
          auVar27 = vpmovzxbd_avx(auVar53);
          auVar27 = vcvtdq2ps_avx(auVar27);
          auVar54._0_4_ = fVar4 + fVar77 * auVar27._0_4_;
          auVar54._4_4_ = fVar4 + fVar77 * auVar27._4_4_;
          auVar54._8_4_ = fVar4 + fVar77 * auVar27._8_4_;
          auVar54._12_4_ = fVar4 + fVar77 * auVar27._12_4_;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)((long)puVar21 + uVar24);
          auVar27 = vpmovzxbd_avx(auVar66);
          auVar27 = vcvtdq2ps_avx(auVar27);
          auVar28._0_4_ = fVar4 + fVar77 * auVar27._0_4_;
          auVar28._4_4_ = fVar4 + fVar77 * auVar27._4_4_;
          auVar28._8_4_ = fVar4 + fVar77 * auVar27._8_4_;
          auVar28._12_4_ = fVar4 + fVar77 * auVar27._12_4_;
          fVar4 = *(float *)((long)puVar21 + 0x1c);
          fVar77 = *(float *)(puVar21 + 5);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)((long)puVar21 + uVar1);
          auVar27 = vpmovzxbd_avx(auVar80);
          auVar27 = vcvtdq2ps_avx(auVar27);
          auVar81._0_4_ = fVar4 + fVar77 * auVar27._0_4_;
          auVar81._4_4_ = fVar4 + fVar77 * auVar27._4_4_;
          auVar81._8_4_ = fVar4 + fVar77 * auVar27._8_4_;
          auVar81._12_4_ = fVar4 + fVar77 * auVar27._12_4_;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)((long)puVar21 + (uVar1 ^ 4));
          auVar27 = vpmovzxbd_avx(auVar96);
          auVar27 = vcvtdq2ps_avx(auVar27);
          auVar39._0_4_ = fVar4 + fVar77 * auVar27._0_4_;
          auVar39._4_4_ = fVar4 + fVar77 * auVar27._4_4_;
          auVar39._8_4_ = fVar4 + fVar77 * auVar27._8_4_;
          auVar39._12_4_ = fVar4 + fVar77 * auVar27._12_4_;
          fVar4 = *(float *)((long)puVar21 + 0x2c);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)((long)puVar21 + uVar2);
          auVar27 = vpmovzxbd_avx(auVar97);
          auVar27 = vcvtdq2ps_avx(auVar27);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)((long)puVar21 + (uVar2 ^ 4));
          auVar42 = vpmovzxbd_avx(auVar102);
          auVar42 = vcvtdq2ps_avx(auVar42);
          fVar77 = *(float *)(puVar21 + 4);
          auVar98._0_4_ = fVar77 + fVar4 * auVar27._0_4_;
          auVar98._4_4_ = fVar77 + fVar4 * auVar27._4_4_;
          auVar98._8_4_ = fVar77 + fVar4 * auVar27._8_4_;
          auVar98._12_4_ = fVar77 + fVar4 * auVar27._12_4_;
          auVar67._0_4_ = fVar77 + fVar4 * auVar42._0_4_;
          auVar67._4_4_ = fVar77 + fVar4 * auVar42._4_4_;
          auVar67._8_4_ = fVar77 + fVar4 * auVar42._8_4_;
          auVar67._12_4_ = fVar77 + fVar4 * auVar42._12_4_;
          auVar27 = vsubps_avx(auVar54,local_8f8);
          auVar55._0_4_ = auVar126._0_4_ * auVar27._0_4_;
          auVar55._4_4_ = auVar126._4_4_ * auVar27._4_4_;
          auVar55._8_4_ = auVar126._8_4_ * auVar27._8_4_;
          auVar55._12_4_ = auVar126._12_4_ * auVar27._12_4_;
          auVar27 = vsubps_avx(auVar81,local_908);
          auVar82._0_4_ = auVar131._0_4_ * auVar27._0_4_;
          auVar82._4_4_ = auVar131._4_4_ * auVar27._4_4_;
          auVar82._8_4_ = auVar131._8_4_ * auVar27._8_4_;
          auVar82._12_4_ = auVar131._12_4_ * auVar27._12_4_;
          auVar27 = vpmaxsd_avx(auVar55,auVar82);
          auVar42 = vsubps_avx(auVar98,local_918);
          auVar83._0_4_ = auVar136._0_4_ * auVar42._0_4_;
          auVar83._4_4_ = auVar136._4_4_ * auVar42._4_4_;
          auVar83._8_4_ = auVar136._8_4_ * auVar42._8_4_;
          auVar83._12_4_ = auVar136._12_4_ * auVar42._12_4_;
          auVar42 = vpmaxsd_avx(auVar83,auVar142._0_16_);
          auVar27 = vpmaxsd_avx(auVar27,auVar42);
          auVar42 = vsubps_avx(auVar28,local_8f8);
          auVar29._0_4_ = auVar126._0_4_ * auVar42._0_4_;
          auVar29._4_4_ = auVar126._4_4_ * auVar42._4_4_;
          auVar29._8_4_ = auVar126._8_4_ * auVar42._8_4_;
          auVar29._12_4_ = auVar126._12_4_ * auVar42._12_4_;
          auVar42 = vsubps_avx(auVar39,local_908);
          auVar40._0_4_ = auVar131._0_4_ * auVar42._0_4_;
          auVar40._4_4_ = auVar131._4_4_ * auVar42._4_4_;
          auVar40._8_4_ = auVar131._8_4_ * auVar42._8_4_;
          auVar40._12_4_ = auVar131._12_4_ * auVar42._12_4_;
          auVar42 = vpminsd_avx(auVar29,auVar40);
          auVar94 = vsubps_avx(auVar67,local_918);
          auVar41._0_4_ = auVar136._0_4_ * auVar94._0_4_;
          auVar41._4_4_ = auVar136._4_4_ * auVar94._4_4_;
          auVar41._8_4_ = auVar136._8_4_ * auVar94._8_4_;
          auVar41._12_4_ = auVar136._12_4_ * auVar94._12_4_;
          auVar94 = vpminsd_avx(auVar41,auVar150._0_16_);
          auVar42 = vpminsd_avx(auVar42,auVar94);
          auVar27 = vpcmpgtd_avx(auVar27,auVar42);
          uVar19 = vmovmskps_avx(auVar27);
          bVar18 = ~(byte)uVar19 & (byte)uVar16;
          if (bVar18 == 0) goto LAB_002cbc94;
          lVar15 = 0;
          if (bVar18 != 0) {
            for (; (bVar18 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          uVar25 = *(ulong *)(uVar14 + lVar15 * 8);
          uVar20 = bVar18 - 1 & (uint)bVar18;
          if (uVar20 != 0) {
            *puVar22 = uVar25;
            puVar22 = puVar22 + 1;
            lVar15 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
              }
            }
            uVar25 = *(ulong *)(uVar14 + lVar15 * 8);
            uVar20 = uVar20 - 1 & uVar20;
            uVar17 = (ulong)uVar20;
            if (uVar20 != 0) {
              do {
                *puVar22 = uVar25;
                puVar22 = puVar22 + 1;
                lVar15 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar25 = *(ulong *)(uVar14 + lVar15 * 8);
                uVar17 = uVar17 & uVar17 - 1;
              } while (uVar17 != 0);
            }
          }
        }
        local_9e8 = (ulong)((uint)uVar25 & 0xf) - 8;
        if (local_9e8 != 0) {
          uVar25 = uVar25 & 0xfffffffffffffff0;
          local_9e0 = 0;
          local_928 = auVar126._0_16_;
          local_938 = auVar131._0_16_;
          local_948 = auVar136._0_16_;
          local_958 = auVar142._0_16_;
          local_968 = auVar150._0_16_;
          local_a50 = context->scene;
          do {
            lVar15 = local_9e0 * 0x50;
            ppfVar6 = (local_a50->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar25 + 0x30 + lVar15)];
            pfVar8 = ppfVar6[*(uint *)(uVar25 + 0x34 + lVar15)];
            pfVar9 = ppfVar6[*(uint *)(uVar25 + 0x38 + lVar15)];
            pfVar10 = ppfVar6[*(uint *)(uVar25 + 0x3c + lVar15)];
            auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + lVar15)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar25 + 8 + lVar15)))
            ;
            auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + lVar15)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar25 + 8 + lVar15)))
            ;
            auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 4 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0xc + lVar15)));
            auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 4 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0xc + lVar15)));
            auVar95 = vunpcklps_avx(auVar27,auVar42);
            auVar43 = vunpcklps_avx(auVar94,auVar64);
            auVar27 = vunpckhps_avx(auVar94,auVar64);
            auVar64 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x10 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x18 + lVar15)));
            auVar42 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x10 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x18 + lVar15)));
            auVar65 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x14 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0x1c + lVar15)));
            auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x14 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0x1c + lVar15)));
            auVar56 = vunpcklps_avx(auVar42,auVar94);
            auVar30 = vunpcklps_avx(auVar64,auVar65);
            auVar42 = vunpckhps_avx(auVar64,auVar65);
            auVar65 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x20 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x28 + lVar15)));
            auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar25 + 0x20 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar25 + 0x28 + lVar15)));
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x24 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0x2c + lVar15)));
            auVar64 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar25 + 0x24 + lVar15)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar25 + 0x2c + lVar15)));
            auVar68 = vunpcklps_avx(auVar94,auVar64);
            auVar64 = vunpcklps_avx(auVar65,auVar31);
            auVar65 = vunpckhps_avx(auVar65,auVar31);
            puVar3 = (undefined8 *)(uVar25 + 0x30 + lVar15);
            local_898 = *puVar3;
            uStack_890 = puVar3[1];
            puVar3 = (undefined8 *)(uVar25 + 0x40 + lVar15);
            local_8a8 = *puVar3;
            uStack_8a0 = puVar3[1];
            uVar16 = *(undefined4 *)&(ray->org).field_0;
            auVar121._4_4_ = uVar16;
            auVar121._0_4_ = uVar16;
            auVar121._8_4_ = uVar16;
            auVar121._12_4_ = uVar16;
            uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar141._4_4_ = uVar16;
            auVar141._0_4_ = uVar16;
            auVar141._8_4_ = uVar16;
            auVar141._12_4_ = uVar16;
            uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar148._4_4_ = uVar16;
            auVar148._0_4_ = uVar16;
            auVar148._8_4_ = uVar16;
            auVar148._12_4_ = uVar16;
            local_9f8 = vsubps_avx(auVar43,auVar121);
            local_a08 = vsubps_avx(auVar27,auVar141);
            local_a18 = vsubps_avx(auVar95,auVar148);
            auVar27 = vsubps_avx(auVar30,auVar121);
            auVar42 = vsubps_avx(auVar42,auVar141);
            auVar94 = vsubps_avx(auVar56,auVar148);
            auVar64 = vsubps_avx(auVar64,auVar121);
            auVar65 = vsubps_avx(auVar65,auVar141);
            auVar95 = vsubps_avx(auVar68,auVar148);
            local_a28 = vsubps_avx(auVar64,local_9f8);
            local_a38 = vsubps_avx(auVar65,local_a08);
            local_a48 = vsubps_avx(auVar95,local_a18);
            fVar4 = local_a08._0_4_;
            fVar37 = auVar65._0_4_ + fVar4;
            fVar86 = local_a08._4_4_;
            fVar49 = auVar65._4_4_ + fVar86;
            fVar62 = local_a08._8_4_;
            fVar50 = auVar65._8_4_ + fVar62;
            fVar12 = local_a08._12_4_;
            fVar51 = auVar65._12_4_ + fVar12;
            fVar125 = local_a18._0_4_;
            fVar78 = fVar125 + auVar95._0_4_;
            fVar127 = local_a18._4_4_;
            fVar87 = fVar127 + auVar95._4_4_;
            fVar128 = local_a18._8_4_;
            fVar90 = fVar128 + auVar95._8_4_;
            fVar129 = local_a18._12_4_;
            fVar92 = fVar129 + auVar95._12_4_;
            fVar52 = local_a48._0_4_;
            auVar113._0_4_ = fVar52 * fVar37;
            fVar61 = local_a48._4_4_;
            auVar113._4_4_ = fVar61 * fVar49;
            fVar35 = local_a48._8_4_;
            auVar113._8_4_ = fVar35 * fVar50;
            fVar36 = local_a48._12_4_;
            auVar113._12_4_ = fVar36 * fVar51;
            fVar157 = local_a38._0_4_;
            auVar122._0_4_ = fVar157 * fVar78;
            fVar159 = local_a38._4_4_;
            auVar122._4_4_ = fVar159 * fVar87;
            fVar160 = local_a38._8_4_;
            auVar122._8_4_ = fVar160 * fVar90;
            fVar161 = local_a38._12_4_;
            auVar122._12_4_ = fVar161 * fVar92;
            auVar43 = vsubps_avx(auVar122,auVar113);
            fVar77 = local_9f8._0_4_;
            fVar112 = auVar64._0_4_ + fVar77;
            fVar89 = local_9f8._4_4_;
            fVar118 = auVar64._4_4_ + fVar89;
            fVar63 = local_9f8._8_4_;
            fVar119 = auVar64._8_4_ + fVar63;
            fVar13 = local_9f8._12_4_;
            fVar120 = auVar64._12_4_ + fVar13;
            fVar146 = local_a28._0_4_;
            auVar84._0_4_ = fVar146 * fVar78;
            fVar151 = local_a28._4_4_;
            auVar84._4_4_ = fVar151 * fVar87;
            fVar153 = local_a28._8_4_;
            auVar84._8_4_ = fVar153 * fVar90;
            fVar155 = local_a28._12_4_;
            auVar84._12_4_ = fVar155 * fVar92;
            auVar123._0_4_ = fVar112 * fVar52;
            auVar123._4_4_ = fVar118 * fVar61;
            auVar123._8_4_ = fVar119 * fVar35;
            auVar123._12_4_ = fVar120 * fVar36;
            auVar56 = vsubps_avx(auVar123,auVar84);
            auVar114._0_4_ = fVar157 * fVar112;
            auVar114._4_4_ = fVar159 * fVar118;
            auVar114._8_4_ = fVar160 * fVar119;
            auVar114._12_4_ = fVar161 * fVar120;
            auVar30._0_4_ = fVar146 * fVar37;
            auVar30._4_4_ = fVar151 * fVar49;
            auVar30._8_4_ = fVar153 * fVar50;
            auVar30._12_4_ = fVar155 * fVar51;
            auVar30 = vsubps_avx(auVar30,auVar114);
            local_a78._4_4_ = (ray->dir).field_0.m128[2];
            local_a88._4_4_ = (ray->dir).field_0.m128[1];
            fStack_a60 = (ray->dir).field_0.m128[0];
            local_a68 = (RTCIntersectArguments *)CONCAT44(fStack_a60,fStack_a60);
            fStack_a5c = fStack_a60;
            local_8c8._0_4_ =
                 auVar43._0_4_ * fStack_a60 +
                 local_a88._4_4_ * auVar56._0_4_ + local_a78._4_4_ * auVar30._0_4_;
            local_8c8._4_4_ =
                 auVar43._4_4_ * fStack_a60 +
                 local_a88._4_4_ * auVar56._4_4_ + local_a78._4_4_ * auVar30._4_4_;
            local_8c8._8_4_ =
                 auVar43._8_4_ * fStack_a60 +
                 local_a88._4_4_ * auVar56._8_4_ + local_a78._4_4_ * auVar30._8_4_;
            local_8c8._12_4_ =
                 auVar43._12_4_ * fStack_a60 +
                 local_a88._4_4_ * auVar56._12_4_ + local_a78._4_4_ * auVar30._12_4_;
            local_8b8 = vsubps_avx(local_a08,auVar42);
            auVar43 = vsubps_avx(local_a18,auVar94);
            fVar37 = fVar4 + auVar42._0_4_;
            fVar49 = fVar86 + auVar42._4_4_;
            fVar50 = fVar62 + auVar42._8_4_;
            fVar51 = fVar12 + auVar42._12_4_;
            fVar78 = fVar125 + auVar94._0_4_;
            fVar87 = fVar127 + auVar94._4_4_;
            fVar90 = fVar128 + auVar94._8_4_;
            fVar92 = fVar129 + auVar94._12_4_;
            fVar130 = auVar43._0_4_;
            auVar149._0_4_ = fVar130 * fVar37;
            fVar132 = auVar43._4_4_;
            auVar149._4_4_ = fVar132 * fVar49;
            fVar133 = auVar43._8_4_;
            auVar149._8_4_ = fVar133 * fVar50;
            fVar134 = auVar43._12_4_;
            auVar149._12_4_ = fVar134 * fVar51;
            fVar140 = local_8b8._0_4_;
            auVar68._0_4_ = fVar140 * fVar78;
            fVar143 = local_8b8._4_4_;
            auVar68._4_4_ = fVar143 * fVar87;
            fVar144 = local_8b8._8_4_;
            auVar68._8_4_ = fVar144 * fVar90;
            fVar145 = local_8b8._12_4_;
            auVar68._12_4_ = fVar145 * fVar92;
            auVar43 = vsubps_avx(auVar68,auVar149);
            auVar56 = vsubps_avx(local_9f8,auVar27);
            fVar147 = auVar56._0_4_;
            auVar85._0_4_ = fVar147 * fVar78;
            fVar152 = auVar56._4_4_;
            auVar85._4_4_ = fVar152 * fVar87;
            fVar154 = auVar56._8_4_;
            auVar85._8_4_ = fVar154 * fVar90;
            fVar156 = auVar56._12_4_;
            auVar85._12_4_ = fVar156 * fVar92;
            fVar78 = fVar77 + auVar27._0_4_;
            fVar87 = fVar89 + auVar27._4_4_;
            fVar90 = fVar63 + auVar27._8_4_;
            fVar92 = fVar13 + auVar27._12_4_;
            auVar115._0_4_ = fVar130 * fVar78;
            auVar115._4_4_ = fVar132 * fVar87;
            auVar115._8_4_ = fVar133 * fVar90;
            auVar115._12_4_ = fVar134 * fVar92;
            auVar56 = vsubps_avx(auVar115,auVar85);
            auVar106._0_4_ = fVar140 * fVar78;
            auVar106._4_4_ = fVar143 * fVar87;
            auVar106._8_4_ = fVar144 * fVar90;
            auVar106._12_4_ = fVar145 * fVar92;
            auVar31._0_4_ = fVar147 * fVar37;
            auVar31._4_4_ = fVar152 * fVar49;
            auVar31._8_4_ = fVar154 * fVar50;
            auVar31._12_4_ = fVar156 * fVar51;
            auVar30 = vsubps_avx(auVar31,auVar106);
            local_878._0_4_ =
                 fStack_a60 * auVar43._0_4_ +
                 local_a88._4_4_ * auVar56._0_4_ + local_a78._4_4_ * auVar30._0_4_;
            local_878._4_4_ =
                 fStack_a60 * auVar43._4_4_ +
                 local_a88._4_4_ * auVar56._4_4_ + local_a78._4_4_ * auVar30._4_4_;
            local_878._8_4_ =
                 fStack_a60 * auVar43._8_4_ +
                 local_a88._4_4_ * auVar56._8_4_ + local_a78._4_4_ * auVar30._8_4_;
            local_878._12_4_ =
                 fStack_a60 * auVar43._12_4_ +
                 local_a88._4_4_ * auVar56._12_4_ + local_a78._4_4_ * auVar30._12_4_;
            auVar43 = vsubps_avx(auVar27,auVar64);
            fVar118 = auVar64._0_4_ + auVar27._0_4_;
            fVar119 = auVar64._4_4_ + auVar27._4_4_;
            fVar120 = auVar64._8_4_ + auVar27._8_4_;
            fVar76 = auVar64._12_4_ + auVar27._12_4_;
            auVar27 = vsubps_avx(auVar42,auVar65);
            fVar87 = auVar42._0_4_ + auVar65._0_4_;
            fVar90 = auVar42._4_4_ + auVar65._4_4_;
            fVar92 = auVar42._8_4_ + auVar65._8_4_;
            fVar112 = auVar42._12_4_ + auVar65._12_4_;
            auVar42 = vsubps_avx(auVar94,auVar95);
            fVar49 = auVar94._0_4_ + auVar95._0_4_;
            fVar50 = auVar94._4_4_ + auVar95._4_4_;
            fVar51 = auVar94._8_4_ + auVar95._8_4_;
            fVar78 = auVar94._12_4_ + auVar95._12_4_;
            fVar79 = auVar42._0_4_;
            auVar99._0_4_ = fVar79 * fVar87;
            fVar88 = auVar42._4_4_;
            auVar99._4_4_ = fVar88 * fVar90;
            fVar91 = auVar42._8_4_;
            auVar99._8_4_ = fVar91 * fVar92;
            fVar93 = auVar42._12_4_;
            auVar99._12_4_ = fVar93 * fVar112;
            fVar135 = auVar27._0_4_;
            auVar107._0_4_ = fVar135 * fVar49;
            fVar137 = auVar27._4_4_;
            auVar107._4_4_ = fVar137 * fVar50;
            fVar138 = auVar27._8_4_;
            auVar107._8_4_ = fVar138 * fVar51;
            fVar139 = auVar27._12_4_;
            auVar107._12_4_ = fVar139 * fVar78;
            auVar27 = vsubps_avx(auVar107,auVar99);
            fVar37 = auVar43._0_4_;
            auVar42._0_4_ = fVar37 * fVar49;
            fVar49 = auVar43._4_4_;
            auVar42._4_4_ = fVar49 * fVar50;
            fVar50 = auVar43._8_4_;
            auVar42._8_4_ = fVar50 * fVar51;
            fVar51 = auVar43._12_4_;
            auVar42._12_4_ = fVar51 * fVar78;
            auVar108._0_4_ = fVar79 * fVar118;
            auVar108._4_4_ = fVar88 * fVar119;
            auVar108._8_4_ = fVar91 * fVar120;
            auVar108._12_4_ = fVar93 * fVar76;
            auVar42 = vsubps_avx(auVar108,auVar42);
            auVar69._0_4_ = fVar135 * fVar118;
            auVar69._4_4_ = fVar137 * fVar119;
            auVar69._8_4_ = fVar138 * fVar120;
            auVar69._12_4_ = fVar139 * fVar76;
            auVar56._0_4_ = fVar37 * fVar87;
            auVar56._4_4_ = fVar49 * fVar90;
            auVar56._8_4_ = fVar50 * fVar92;
            auVar56._12_4_ = fVar51 * fVar112;
            auVar94 = vsubps_avx(auVar56,auVar69);
            local_a78._0_4_ = local_a78._4_4_;
            fStack_a70 = local_a78._4_4_;
            fStack_a6c = local_a78._4_4_;
            local_a88._0_4_ = local_a88._4_4_;
            fStack_a80 = local_a88._4_4_;
            fStack_a7c = local_a88._4_4_;
            auVar43._0_4_ =
                 fStack_a60 * auVar27._0_4_ +
                 local_a88._4_4_ * auVar42._0_4_ + local_a78._4_4_ * auVar94._0_4_;
            auVar43._4_4_ =
                 fStack_a60 * auVar27._4_4_ +
                 local_a88._4_4_ * auVar42._4_4_ + local_a78._4_4_ * auVar94._4_4_;
            auVar43._8_4_ =
                 fStack_a60 * auVar27._8_4_ +
                 local_a88._4_4_ * auVar42._8_4_ + local_a78._4_4_ * auVar94._8_4_;
            auVar43._12_4_ =
                 fStack_a60 * auVar27._12_4_ +
                 local_a88._4_4_ * auVar42._12_4_ + local_a78._4_4_ * auVar94._12_4_;
            local_868._0_4_ = auVar43._0_4_ + local_8c8._0_4_ + local_878._0_4_;
            local_868._4_4_ = auVar43._4_4_ + local_8c8._4_4_ + local_878._4_4_;
            local_868._8_4_ = auVar43._8_4_ + local_8c8._8_4_ + local_878._8_4_;
            local_868._12_4_ = auVar43._12_4_ + local_8c8._12_4_ + local_878._12_4_;
            auVar27 = vminps_avx(local_8c8,local_878);
            auVar27 = vminps_avx(auVar27,auVar43);
            auVar70._8_4_ = 0x7fffffff;
            auVar70._0_8_ = 0x7fffffff7fffffff;
            auVar70._12_4_ = 0x7fffffff;
            auVar111 = ZEXT1664(auVar70);
            local_8d8 = vandps_avx(local_868,auVar70);
            auVar71._0_4_ = local_8d8._0_4_ * 1.1920929e-07;
            auVar71._4_4_ = local_8d8._4_4_ * 1.1920929e-07;
            auVar71._8_4_ = local_8d8._8_4_ * 1.1920929e-07;
            auVar71._12_4_ = local_8d8._12_4_ * 1.1920929e-07;
            uVar14 = CONCAT44(auVar71._4_4_,auVar71._0_4_);
            auVar100._0_8_ = uVar14 ^ 0x8000000080000000;
            auVar100._8_4_ = -auVar71._8_4_;
            auVar100._12_4_ = -auVar71._12_4_;
            auVar27 = vcmpps_avx(auVar27,auVar100,5);
            auVar42 = vmaxps_avx(local_8c8,local_878);
            auVar42 = vmaxps_avx(auVar42,auVar43);
            auVar42 = vcmpps_avx(auVar42,auVar71,2);
            local_8e8 = vorps_avx(auVar27,auVar42);
            local_a8d = 0;
            auVar27 = local_978 & local_8e8;
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar27[0xf] < '\0') {
              auVar44._0_4_ = fVar140 * fVar52;
              auVar44._4_4_ = fVar143 * fVar61;
              auVar44._8_4_ = fVar144 * fVar35;
              auVar44._12_4_ = fVar145 * fVar36;
              auVar57._0_4_ = fVar157 * fVar130;
              auVar57._4_4_ = fVar159 * fVar132;
              auVar57._8_4_ = fVar160 * fVar133;
              auVar57._12_4_ = fVar161 * fVar134;
              auVar94 = vsubps_avx(auVar57,auVar44);
              auVar72._0_4_ = fVar130 * fVar135;
              auVar72._4_4_ = fVar132 * fVar137;
              auVar72._8_4_ = fVar133 * fVar138;
              auVar72._12_4_ = fVar134 * fVar139;
              auVar101._0_4_ = fVar140 * fVar79;
              auVar101._4_4_ = fVar143 * fVar88;
              auVar101._8_4_ = fVar144 * fVar91;
              auVar101._12_4_ = fVar145 * fVar93;
              auVar64 = vsubps_avx(auVar101,auVar72);
              auVar27 = vandps_avx(auVar70,auVar44);
              auVar42 = vandps_avx(auVar70,auVar72);
              auVar27 = vcmpps_avx(auVar27,auVar42,1);
              local_808 = vblendvps_avx(auVar64,auVar94,auVar27);
              auVar45._0_4_ = fVar147 * fVar79;
              auVar45._4_4_ = fVar152 * fVar88;
              auVar45._8_4_ = fVar154 * fVar91;
              auVar45._12_4_ = fVar156 * fVar93;
              auVar58._0_4_ = fVar147 * fVar52;
              auVar58._4_4_ = fVar152 * fVar61;
              auVar58._8_4_ = fVar154 * fVar35;
              auVar58._12_4_ = fVar156 * fVar36;
              auVar73._0_4_ = fVar130 * fVar146;
              auVar73._4_4_ = fVar132 * fVar151;
              auVar73._8_4_ = fVar133 * fVar153;
              auVar73._12_4_ = fVar134 * fVar155;
              auVar94 = vsubps_avx(auVar58,auVar73);
              auVar103._0_4_ = fVar130 * fVar37;
              auVar103._4_4_ = fVar132 * fVar49;
              auVar103._8_4_ = fVar133 * fVar50;
              auVar103._12_4_ = fVar134 * fVar51;
              auVar64 = vsubps_avx(auVar103,auVar45);
              auVar27 = vandps_avx(auVar70,auVar73);
              auVar42 = vandps_avx(auVar70,auVar45);
              auVar27 = vcmpps_avx(auVar27,auVar42,1);
              local_7f8 = vblendvps_avx(auVar64,auVar94,auVar27);
              auVar32._0_4_ = fVar140 * fVar37;
              auVar32._4_4_ = fVar143 * fVar49;
              auVar32._8_4_ = fVar144 * fVar50;
              auVar32._12_4_ = fVar145 * fVar51;
              auVar59._0_4_ = fVar140 * fVar146;
              auVar59._4_4_ = fVar143 * fVar151;
              auVar59._8_4_ = fVar144 * fVar153;
              auVar59._12_4_ = fVar145 * fVar155;
              auVar74._0_4_ = fVar157 * fVar147;
              auVar74._4_4_ = fVar159 * fVar152;
              auVar74._8_4_ = fVar160 * fVar154;
              auVar74._12_4_ = fVar161 * fVar156;
              auVar104._0_4_ = fVar147 * fVar135;
              auVar104._4_4_ = fVar152 * fVar137;
              auVar104._8_4_ = fVar154 * fVar138;
              auVar104._12_4_ = fVar156 * fVar139;
              auVar94 = vsubps_avx(auVar59,auVar74);
              auVar64 = vsubps_avx(auVar104,auVar32);
              auVar27 = vandps_avx(auVar70,auVar74);
              auVar42 = vandps_avx(auVar70,auVar32);
              auVar27 = vcmpps_avx(auVar27,auVar42,1);
              local_7e8 = vblendvps_avx(auVar64,auVar94,auVar27);
              fVar52 = local_808._0_4_ * fStack_a60 +
                       local_7f8._0_4_ * local_a88._4_4_ + local_7e8._0_4_ * local_a78._4_4_;
              fVar37 = local_808._4_4_ * fStack_a60 +
                       local_7f8._4_4_ * local_a88._4_4_ + local_7e8._4_4_ * local_a78._4_4_;
              fVar61 = local_808._8_4_ * fStack_a60 +
                       local_7f8._8_4_ * local_a88._4_4_ + local_7e8._8_4_ * local_a78._4_4_;
              fVar49 = local_808._12_4_ * fStack_a60 +
                       local_7f8._12_4_ * local_a88._4_4_ + local_7e8._12_4_ * local_a78._4_4_;
              auVar75._0_4_ = fVar52 + fVar52;
              auVar75._4_4_ = fVar37 + fVar37;
              auVar75._8_4_ = fVar61 + fVar61;
              auVar75._12_4_ = fVar49 + fVar49;
              fVar52 = local_808._0_4_ * fVar77 +
                       local_7f8._0_4_ * fVar4 + local_7e8._0_4_ * fVar125;
              fVar37 = local_808._4_4_ * fVar89 +
                       local_7f8._4_4_ * fVar86 + local_7e8._4_4_ * fVar127;
              fVar62 = local_808._8_4_ * fVar63 +
                       local_7f8._8_4_ * fVar62 + local_7e8._8_4_ * fVar128;
              fVar63 = local_808._12_4_ * fVar13 +
                       local_7f8._12_4_ * fVar12 + local_7e8._12_4_ * fVar129;
              auVar27 = vrcpps_avx(auVar75);
              fVar4 = auVar27._0_4_;
              auVar109._0_4_ = auVar75._0_4_ * fVar4;
              fVar77 = auVar27._4_4_;
              auVar109._4_4_ = auVar75._4_4_ * fVar77;
              fVar86 = auVar27._8_4_;
              auVar109._8_4_ = auVar75._8_4_ * fVar86;
              fVar89 = auVar27._12_4_;
              auVar109._12_4_ = auVar75._12_4_ * fVar89;
              auVar116._8_4_ = 0x3f800000;
              auVar116._0_8_ = 0x3f8000003f800000;
              auVar116._12_4_ = 0x3f800000;
              auVar27 = vsubps_avx(auVar116,auVar109);
              local_818._0_4_ = (fVar52 + fVar52) * (fVar4 + fVar4 * auVar27._0_4_);
              local_818._4_4_ = (fVar37 + fVar37) * (fVar77 + fVar77 * auVar27._4_4_);
              local_818._8_4_ = (fVar62 + fVar62) * (fVar86 + fVar86 * auVar27._8_4_);
              local_818._12_4_ = (fVar63 + fVar63) * (fVar89 + fVar89 * auVar27._12_4_);
              uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar105._4_4_ = uVar16;
              auVar105._0_4_ = uVar16;
              auVar105._8_4_ = uVar16;
              auVar105._12_4_ = uVar16;
              auVar27 = vcmpps_avx(auVar105,local_818,2);
              fVar4 = ray->tfar;
              auVar110._4_4_ = fVar4;
              auVar110._0_4_ = fVar4;
              auVar110._8_4_ = fVar4;
              auVar110._12_4_ = fVar4;
              auVar42 = vcmpps_avx(local_818,auVar110,2);
              auVar27 = vandps_avx(auVar27,auVar42);
              auVar42 = vcmpps_avx(auVar75,_DAT_01f7aa10,4);
              auVar27 = vandps_avx(auVar42,auVar27);
              auVar42 = vpand_avx(local_8e8,local_978);
              auVar27 = vpslld_avx(auVar27,0x1f);
              auVar27 = vpsrad_avx(auVar27,0x1f);
              local_848 = vpand_avx(auVar27,auVar42);
              uVar20 = vmovmskps_avx(local_848);
              if (uVar20 != 0) {
                local_888 = local_8c8;
                local_858 = &local_a8d;
                auVar27 = vrcpps_avx(local_868);
                fVar4 = auVar27._0_4_;
                auVar46._0_4_ = local_868._0_4_ * fVar4;
                fVar77 = auVar27._4_4_;
                auVar46._4_4_ = local_868._4_4_ * fVar77;
                fVar86 = auVar27._8_4_;
                auVar46._8_4_ = local_868._8_4_ * fVar86;
                fVar89 = auVar27._12_4_;
                auVar46._12_4_ = local_868._12_4_ * fVar89;
                auVar60._8_4_ = 0x3f800000;
                auVar60._0_8_ = 0x3f8000003f800000;
                auVar60._12_4_ = 0x3f800000;
                auVar27 = vsubps_avx(auVar60,auVar46);
                auVar33._0_4_ = fVar4 + fVar4 * auVar27._0_4_;
                auVar33._4_4_ = fVar77 + fVar77 * auVar27._4_4_;
                auVar33._8_4_ = fVar86 + fVar86 * auVar27._8_4_;
                auVar33._12_4_ = fVar89 + fVar89 * auVar27._12_4_;
                auVar47._8_4_ = 0x219392ef;
                auVar47._0_8_ = 0x219392ef219392ef;
                auVar47._12_4_ = 0x219392ef;
                auVar27 = vcmpps_avx(local_8d8,auVar47,5);
                auVar27 = vandps_avx(auVar27,auVar33);
                auVar48._0_4_ = local_8c8._0_4_ * auVar27._0_4_;
                auVar48._4_4_ = local_8c8._4_4_ * auVar27._4_4_;
                auVar48._8_4_ = local_8c8._8_4_ * auVar27._8_4_;
                auVar48._12_4_ = local_8c8._12_4_ * auVar27._12_4_;
                local_838 = vminps_avx(auVar48,auVar60);
                auVar34._0_4_ = local_878._0_4_ * auVar27._0_4_;
                auVar34._4_4_ = local_878._4_4_ * auVar27._4_4_;
                auVar34._8_4_ = local_878._8_4_ * auVar27._8_4_;
                auVar34._12_4_ = local_878._12_4_ * auVar27._12_4_;
                local_828 = vminps_avx(auVar34,auVar60);
                uVar14 = (ulong)(uVar20 & 0xff);
                do {
                  uVar17 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  local_9c0 = *(uint *)((long)&local_898 + uVar17 * 4);
                  pGVar11 = (local_a50->geometries).items[local_9c0].ptr;
                  if ((pGVar11->mask & ray->mask) == 0) {
                    uVar14 = uVar14 ^ 1L << (uVar17 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002cbca4;
                    local_a68 = context->args;
                    local_a18._0_8_ = uVar14;
                    local_a08._0_8_ = uVar23;
                    local_9f8._0_8_ = puVar22;
                    local_a78 = context;
                    local_9a8.context = context->user;
                    local_9d8 = *(undefined4 *)(local_808 + uVar17 * 4);
                    local_9d4 = *(undefined4 *)(local_7f8 + uVar17 * 4);
                    local_9d0 = *(undefined4 *)(local_7e8 + uVar17 * 4);
                    local_9cc = *(undefined4 *)(local_838 + uVar17 * 4);
                    local_9c8 = *(undefined4 *)(local_828 + uVar17 * 4);
                    local_9c4 = *(undefined4 *)((long)&local_8a8 + uVar17 * 4);
                    local_9bc = (local_9a8.context)->instID[0];
                    local_9b8 = (local_9a8.context)->instPrimID[0];
                    local_a38._0_4_ = ray->tfar;
                    local_a28._0_8_ = uVar17;
                    ray->tfar = *(float *)(local_818 + uVar17 * 4);
                    local_a8c = -1;
                    local_9a8.valid = &local_a8c;
                    local_9a8.geometryUserPtr = pGVar11->userPtr;
                    local_a88 = ray;
                    local_9a8.hit = (RTCHitN *)&local_9d8;
                    local_9a8.N = 1;
                    local_a48._0_8_ = pGVar11;
                    local_9a8.ray = (RTCRayN *)ray;
                    if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar11->occlusionFilterN)(&local_9a8), *local_9a8.valid != 0)) {
                      ray = local_a88;
                      if ((local_a68->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_a68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_a48._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002cbca4:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (*local_a68->filter)(&local_9a8);
                      ray = local_a88;
                      if (*local_9a8.valid != 0) goto LAB_002cbca4;
                    }
                    local_a88->tfar = (float)local_a38._0_4_;
                    uVar14 = local_a18._0_8_ ^ 1L << (local_a28._0_8_ & 0x3f);
                    ray = local_a88;
                    context = local_a78;
                    puVar22 = (ulong *)local_9f8._0_8_;
                    uVar23 = local_a08._0_8_;
                  }
                  auVar70 = auVar111._0_16_;
                } while (uVar14 != 0);
              }
            }
            local_9e0 = local_9e0 + 1;
            auVar111 = ZEXT1664(local_8f8);
            auVar117 = ZEXT1664(local_908);
            auVar124 = ZEXT1664(local_918);
            auVar126 = ZEXT1664(local_928);
            auVar131 = ZEXT1664(local_938);
            auVar136 = ZEXT1664(local_948);
            auVar142 = ZEXT1664(local_958);
            auVar150 = ZEXT1664(local_968);
            auVar27 = vpcmpeqd_avx(auVar70,auVar70);
            auVar158 = ZEXT1664(auVar27);
          } while (local_9e0 != local_9e8);
        }
LAB_002cbc94:
      } while (puVar22 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }